

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O2

void __thiscall jsonChildren::doerase(jsonChildren *this,JSONNode **position,json_index_t number)

{
  uint uVar1;
  JSONNode **ppJVar2;
  JSONNode **ppJVar3;
  ulong uVar4;
  allocator local_55;
  json_index_t local_54;
  json_string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"Children is null doerase",&local_55);
  JSONDebug::_JSON_ASSERT(true,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ppJVar2 = this->array;
  std::__cxx11::string::string
            ((string *)&local_50,"erasing something from a null array 2",&local_55);
  JSONDebug::_JSON_ASSERT(ppJVar2 != (JSONNode **)0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ppJVar2 = this->array;
  std::__cxx11::string::string
            ((string *)&local_50,"position is beneath the start of the array 2",&local_55);
  JSONDebug::_JSON_ASSERT(ppJVar2 <= position,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ppJVar3 = this->array;
  uVar1 = this->mysize;
  std::__cxx11::string::string((string *)&local_50,"erasing out of bounds 2",&local_55);
  ppJVar2 = position + number;
  local_54 = number;
  JSONDebug::_JSON_ASSERT(ppJVar2 <= ppJVar3 + uVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar4 = (ulong)((long)position - (long)this->array) >> 3;
  if (ppJVar2 < this->array + this->mysize) {
    memmove(position,ppJVar2,((ulong)this->mysize - (uVar4 + number)) * 8);
    uVar4 = (ulong)(this->mysize - local_54);
  }
  this->mysize = (json_index_t)uVar4;
  return;
}

Assistant:

void jsonChildren::doerase(JSONNode ** position, json_index_t number) json_nothrow {
    JSON_ASSERT(this != 0, JSON_TEXT("Children is null doerase"));
    JSON_ASSERT(array != 0, JSON_TEXT("erasing something from a null array 2"));
    JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array 2"));
    JSON_ASSERT(position + number <= array + mysize, JSON_TEXT("erasing out of bounds 2"));
    if (position + number >= array + mysize){
	   mysize = (json_index_t)(position - array);
	   #ifndef JSON_ISO_STRICT
		  JSON_ASSERT((long long)position - (long long)array >= 0, JSON_TEXT("doing negative allocation"));
	   #endif
    } else {
	   std::memmove(position, position + number, (mysize - (position - array) - number) * sizeof(JSONNode *));
	   mysize -= number;
    }
}